

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType brasteptype,RRStepType ketsteptype)

{
  initializer_list<QAM> __l;
  less<QAM> *in_RDI;
  RRStepType in_stack_00000660;
  RRStepType in_stack_00000664;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *in_stack_00000668;
  OSTEI_HRR_Algorithm_Base *in_stack_00000670;
  QAM *in_stack_ffffffffffffff08;
  QAM *in_stack_ffffffffffffff10;
  undefined1 **local_b8;
  allocator_type *__a;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  undefined1 **ppuVar1;
  undefined1 *local_88 [6];
  undefined8 *local_58;
  undefined8 local_50;
  
  ppuVar1 = local_88;
  QAM::QAM(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_58 = local_88;
  local_50 = 1;
  __a = (allocator_type *)&stack0xffffffffffffff62;
  std::allocator<QAM>::allocator((allocator<QAM> *)0x1362db);
  __l._M_len = (size_type)ppuVar1;
  __l._M_array = in_stack_ffffffffffffff68;
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set(in_stack_ffffffffffffff60,__l,in_RDI,__a)
  ;
  Create(in_stack_00000670,in_stack_00000668,in_stack_00000664,in_stack_00000660);
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x136333);
  std::allocator<QAM>::~allocator((allocator<QAM> *)0x13633d);
  local_b8 = (undefined1 **)&local_58;
  do {
    local_b8 = local_b8 + -6;
    QAM::~QAM((QAM *)0x136363);
  } while (local_b8 != local_88);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(QAM am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    Create(std::set<QAM>{am}, brasteptype, ketsteptype);
}